

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O3

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
            *this)

{
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  _Var1;
  _List_node_base *p_Var2;
  iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  __value;
  iterator_range<std::_List_iterator<char>_> *piVar3;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  __cmp;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_ffffffffffffffe8;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  local_b;
  
  _Var1._M_current = (this->m_begin)._M_current;
  piVar3 = (this->m_end)._M_current;
  if (0x10 < (long)piVar3 - (long)_Var1._M_current) {
    __value = piVar3[-1].
              super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
    ;
    p_Var2 = ((_Var1._M_current)->
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_node;
    piVar3[-1].
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_node =
         ((_Var1._M_current)->
         super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
         ).
         super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin._M_node;
    piVar3[-1].
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
    .m_End._M_node = p_Var2;
    std::
    __adjust_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,long,boost::iterator_range<std::_List_iterator<char>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,0,(long)piVar3 + (-0x10 - (long)_Var1._M_current) >> 4,
               (iterator_range<std::_List_iterator<char>_>)__value,in_stack_ffffffffffffffe8);
    piVar3 = (this->m_end)._M_current;
  }
  p_Var2 = (piVar3[-1].
            super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin._M_node)->_M_next;
  piVar3[-1].
  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_node = p_Var2;
  if (p_Var2 == piVar3[-1].
                super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                .m_End._M_node) {
    (this->m_end)._M_current = piVar3 + -1;
  }
  else {
    _Var1._M_current = (this->m_begin)._M_current;
    piVar3 = (this->m_end)._M_current;
    std::
    __push_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,long,boost::iterator_range<std::_List_iterator<char>>,__gnu_cxx::__ops::_Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,((long)piVar3 - (long)_Var1._M_current >> 4) + -1,0,
               (iterator_range<std::_List_iterator<char>_>)
               piVar3[-1].
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ,&local_b);
  }
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }